

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_patternstring.cpp
# Opt level: O0

void __thiscall
icu_63::number::impl::ParsedPatternInfo::consumeAffix
          (ParsedPatternInfo *this,Endpoints *endpoints,UErrorCode *status)

{
  UBool UVar1;
  UChar32 UVar2;
  UErrorCode *status_local;
  Endpoints *endpoints_local;
  ParsedPatternInfo *this_local;
  
  endpoints->start = (this->state).offset;
  while ((UVar2 = ParserState::peek(&this->state), UVar2 != -1 && (UVar2 != 0x23))) {
    if (UVar2 == 0x25) {
      this->currentSubpattern->hasPercentSign = true;
    }
    else {
      if (UVar2 == 0x2a) break;
      if (UVar2 == 0x2b) {
        this->currentSubpattern->hasPlusSign = true;
      }
      else {
        if (UVar2 == 0x2c) break;
        if (UVar2 == 0x2d) {
          this->currentSubpattern->hasMinusSign = true;
        }
        else {
          if ((((UVar2 == 0x2e) || (UVar2 - 0x30U < 10)) || (UVar2 == 0x3b)) || (UVar2 == 0x40))
          break;
          if (UVar2 == 0xa4) {
            this->currentSubpattern->hasCurrencySign = true;
          }
          else if (UVar2 == 0x2030) {
            this->currentSubpattern->hasPerMilleSign = true;
          }
        }
      }
    }
    consumeLiteral(this,status);
    UVar1 = ::U_FAILURE(*status);
    if (UVar1 != '\0') {
      return;
    }
  }
  endpoints->end = (this->state).offset;
  return;
}

Assistant:

void ParsedPatternInfo::consumeAffix(Endpoints& endpoints, UErrorCode& status) {
    // literals := { literal }
    endpoints.start = state.offset;
    while (true) {
        switch (state.peek()) {
            case u'#':
            case u'@':
            case u';':
            case u'*':
            case u'.':
            case u',':
            case u'0':
            case u'1':
            case u'2':
            case u'3':
            case u'4':
            case u'5':
            case u'6':
            case u'7':
            case u'8':
            case u'9':
            case -1:
                // Characters that cannot appear unquoted in a literal
                // break outer;
                goto after_outer;

            case u'%':
                currentSubpattern->hasPercentSign = true;
                break;

            case u'‰':
                currentSubpattern->hasPerMilleSign = true;
                break;

            case u'¤':
                currentSubpattern->hasCurrencySign = true;
                break;

            case u'-':
                currentSubpattern->hasMinusSign = true;
                break;

            case u'+':
                currentSubpattern->hasPlusSign = true;
                break;

            default:
                break;
        }
        consumeLiteral(status);
        if (U_FAILURE(status)) { return; }
    }
    after_outer:
    endpoints.end = state.offset;
}